

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_setcursor(_glist *x,uint cursornum)

{
  uint cursornum_local;
  _glist *x_local;
  
  if (cursornum < 8) {
    if ((*(_glist **)((pd_maininstance.pd_gui)->i_editor + 0x88) != x) ||
       (*(uint *)((pd_maininstance.pd_gui)->i_editor + 0x90) != cursornum)) {
      pdgui_vmess((char *)0x0,"^r rr",x,"configure","-cursor",cursorlist[cursornum]);
      *(_glist **)((pd_maininstance.pd_gui)->i_editor + 0x88) = x;
      *(uint *)((pd_maininstance.pd_gui)->i_editor + 0x90) = cursornum;
    }
  }
  else {
    bug("canvas_setcursor");
  }
  return;
}

Assistant:

void canvas_setcursor(t_canvas *x, unsigned int cursornum)
{
    if (cursornum >= sizeof(cursorlist)/sizeof *cursorlist)
    {
        bug("canvas_setcursor");
        return;
    }
    if (EDITOR->canvas_cursorcanvaswas != x ||
        EDITOR->canvas_cursorwas != cursornum)
    {
        pdgui_vmess(0, "^r rr", x, "configure", "-cursor", cursorlist[cursornum]);
        EDITOR->canvas_cursorcanvaswas = x;
        EDITOR->canvas_cursorwas = cursornum;
    }
}